

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

Index __thiscall
PlanningUnitMADPDiscrete::GetJointActionHistoryIndex
          (PlanningUnitMADPDiscrete *this,Index t,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *jointActions)

{
  Index *indices;
  Index IVar1;
  int iVar2;
  const_reference pvVar3;
  undefined4 extraout_var;
  PlanningUnitMADPDiscrete *this_00;
  
  pvVar3 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::at
                     (&this->_m_firstJAHIforT,(ulong)t);
  IVar1 = Globals::CastLIndexToIndex(*pvVar3);
  this_00 = (PlanningUnitMADPDiscrete *)this->_m_madp;
  indices = (jointActions->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar2 = (*(this_00->super_PlanningUnit)._vptr_PlanningUnit[0xd])();
  IVar1 = ComputeHistoryIndex(this_00,t,IVar1,indices,CONCAT44(extraout_var,iVar2));
  return IVar1;
}

Assistant:

Index PlanningUnitMADPDiscrete::GetJointActionHistoryIndex(
        Index t, const vector<Index>& jointActions) const
{
    return( ComputeHistoryIndex(
                t, 
                CastLIndexToIndex(_m_firstJAHIforT.at(t)), 
                &jointActions[0],
                GetNrJointActions()
                )
          );    
/*
    size_t this_JAHI=_m_firstJAHIforT.at(t);
    size_t nrJA = GetNrJointActions();
    for (Index ts=0; ts<t; ts++)
    {
        int exponent = t-1 - ts;
        size_t b = (size_t) pow((double)nrJA, (double)(exponent));
        this_JAHI += jointActions.at(ts) * b;
    }
    return(this_JAHI);*/
}